

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall leveldb::DBImpl::DumpRange(DBImpl *this,string *fname,Slice *start,Slice *end)

{
  TableBuilder *pTVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  Snapshot *pSVar5;
  uint64_t uVar6;
  undefined8 in_R8;
  undefined1 auVar7 [16];
  Slice SVar8;
  Status local_138;
  Status local_130;
  Status local_128;
  Status local_120;
  Status local_118;
  TableBuilder local_110;
  Slice local_108;
  Slice local_f8;
  undefined1 local_e8 [16];
  long *local_d8;
  Iterator *it;
  ReadOptions readoption;
  TableBuilder *builder;
  Options options;
  Status local_48;
  WritableFile *local_40;
  WritableFile *file;
  undefined8 local_30;
  Slice *end_local;
  Slice *start_local;
  string *fname_local;
  DBImpl *this_local;
  Status *s;
  
  file._7_1_ = 0;
  local_30 = in_R8;
  end_local = end;
  start_local = start;
  fname_local = fname;
  this_local = this;
  Status::Status((Status *)this);
  (**(code **)(**(long **)(fname + 8) + 0x20))
            (&local_48,*(long **)(fname + 8),start_local,&local_40);
  Status::~Status(&local_48);
  Options::Options((Options *)&builder);
  options.compression = kNoCompression;
  options.reuse_logs = false;
  options._85_3_ = 0;
  options.max_file_size._0_4_ = 1;
  pSVar5 = (Snapshot *)operator_new(8);
  TableBuilder::TableBuilder((TableBuilder *)pSVar5,(Options *)&builder,local_40);
  readoption.snapshot = pSVar5;
  ReadOptions::ReadOptions((ReadOptions *)&it);
  it._1_1_ = 1;
  local_d8 = (long *)(**(code **)(*(long *)fname + 0x30))(fname,(ReadOptions *)&it);
  (**(code **)(*local_d8 + 0x28))(local_d8,end_local);
  while( true ) {
    bVar2 = (**(code **)(*local_d8 + 0x10))();
    pTVar1 = builder;
    bVar3 = false;
    if ((bVar2 & 1) != 0) {
      auVar7 = (**(code **)(*local_d8 + 0x40))();
      local_e8 = auVar7;
      iVar4 = (*(code *)(pTVar1->rep_->options).env)(pTVar1,local_e8,local_30);
      bVar3 = iVar4 < 0;
    }
    pSVar5 = readoption.snapshot;
    if (!bVar3) break;
    SVar8 = (Slice)(**(code **)(*local_d8 + 0x40))();
    local_f8 = SVar8;
    SVar8 = (Slice)(**(code **)(*local_d8 + 0x48))();
    local_108 = SVar8;
    TableBuilder::Add((TableBuilder *)pSVar5,&local_f8,&local_108);
    (**(code **)(*local_d8 + 0x30))();
  }
  TableBuilder::Finish(&local_110);
  Status::operator=((Status *)this,(Status *)&local_110);
  Status::~Status((Status *)&local_110);
  bVar3 = Status::ok((Status *)this);
  if (bVar3) {
    uVar6 = TableBuilder::FileSize((TableBuilder *)readoption.snapshot);
    if (uVar6 == 0) {
      __assert_fail("builder->FileSize() > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                    ,0x5c9,
                    "virtual Status leveldb::DBImpl::DumpRange(const std::string &, const Slice &, const Slice &)"
                   );
    }
  }
  pSVar5 = readoption.snapshot;
  if (readoption.snapshot != (Snapshot *)0x0) {
    TableBuilder::~TableBuilder((TableBuilder *)readoption.snapshot);
    operator_delete(pSVar5);
  }
  bVar3 = Status::ok((Status *)this);
  if (bVar3) {
    (*local_40->_vptr_WritableFile[5])(&local_118);
    Status::operator=((Status *)this,&local_118);
    Status::~Status(&local_118);
  }
  bVar3 = Status::ok((Status *)this);
  if (bVar3) {
    (*local_40->_vptr_WritableFile[3])(&local_120);
    Status::operator=((Status *)this,&local_120);
    Status::~Status(&local_120);
  }
  if (local_40 != (WritableFile *)0x0) {
    (*local_40->_vptr_WritableFile[1])();
  }
  local_40 = (WritableFile *)0x0;
  (**(code **)(*local_d8 + 0x50))(&local_128);
  bVar3 = Status::ok(&local_128);
  Status::~Status(&local_128);
  if (((bVar3 ^ 0xffU) & 1) != 0) {
    (**(code **)(*local_d8 + 0x50))(&local_130);
    Status::operator=((Status *)this,&local_130);
    Status::~Status(&local_130);
  }
  if (local_d8 != (long *)0x0) {
    (**(code **)(*local_d8 + 8))();
  }
  bVar3 = Status::ok((Status *)this);
  if (!bVar3) {
    (**(code **)(**(long **)(fname + 8) + 0x40))(&local_138,*(long **)(fname + 8),start_local);
    Status::~Status(&local_138);
  }
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::DumpRange(const std::string& fname,
                         const Slice& start, 
                         const Slice& end) {
    Status s;
    WritableFile* file;
    env_->NewWritableFile(fname, &file);

    Options options;
    options.filter_policy = nullptr;
    options.compression = kSnappyCompression;
    TableBuilder* builder = new TableBuilder(options, file);

    ReadOptions readoption;
    readoption.fill_cache = true;
    Iterator *it = NewIterator(readoption);
    //printf("START DUMPING....\n");
    
    for (it->Seek(start); 
         it->Valid() && options.comparator->Compare(it->key(), end) < 0;
         it->Next()) {
       //printf("\rDUMP FOR KEY: %s\n", it->key().ToString().c_str());
       builder->Add(it->key(), it->value());
    }

    // Finish and check for builder errors
    s = builder->Finish();
    if (s.ok()) {
      assert(builder->FileSize() > 0);
    }
    delete builder;

    // Finish and check for file errors
    if (s.ok()) {
      s = file->Sync();
    }
    if (s.ok()) {
      s = file->Close();
    }
    delete file;
    file = nullptr;

    // Check for input iterator errors
    if (!it->status().ok()) {
      s = it->status();
    }
    delete it;

    if (s.ok()) {
      // Keep it
    } else {
      env_->DeleteFile(fname);
    }
    return s;
}